

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

void Js::RegexHelper::PrimBeginMatch
               (RegexMatchState *state,ScriptContext *scriptContext,RegexPattern *pattern,
               char16 *input,CharCount inputLength,bool alwaysNeedAlloc)

{
  Matcher **ppMVar1;
  Matcher *ptr;
  TempArenaAllocatorObject *pTVar2;
  bool alwaysNeedAlloc_local;
  CharCount inputLength_local;
  char16 *input_local;
  RegexPattern *pattern_local;
  ScriptContext *scriptContext_local;
  RegexMatchState *state_local;
  
  state->input = input;
  ppMVar1 = Memory::WriteBarrierPtr::operator_cast_to_Matcher__
                      ((WriteBarrierPtr *)&(pattern->rep).unified.matcher);
  if (*ppMVar1 == (Matcher *)0x0) {
    ptr = UnifiedRegex::Matcher::New(scriptContext,pattern);
    Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator=(&(pattern->rep).unified.matcher,ptr);
  }
  if (alwaysNeedAlloc) {
    pTVar2 = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexUnifiedExecTemp");
    state->tempAllocatorObj = pTVar2;
  }
  else {
    state->tempAllocatorObj = (TempArenaAllocatorObject *)0x0;
  }
  return;
}

Assistant:

void RegexHelper::PrimBeginMatch(RegexMatchState& state, ScriptContext* scriptContext, UnifiedRegex::RegexPattern* pattern, const char16* input, CharCount inputLength, bool alwaysNeedAlloc)
    {
        state.input = input;
        if (pattern->rep.unified.matcher == 0)
            pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
        if (alwaysNeedAlloc)
            state.tempAllocatorObj = scriptContext->GetTemporaryAllocator(_u("RegexUnifiedExecTemp"));
        else
            state.tempAllocatorObj = 0;
    }